

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O0

string * __thiscall
cmExportInstallFileGenerator::GetFileSetDirectories_abi_cxx11_
          (string *__return_storage_ptr__,cmExportInstallFileGenerator *this,cmGeneratorTarget *gte,
          cmFileSet *fileSet,cmTargetExport *te)

{
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  undefined8 config_00;
  cmFileSet *headTarget;
  bool bVar1;
  cmake *cmakeInstance;
  mapped_type *ppcVar2;
  pointer pcVar3;
  string *psVar4;
  cmLocalGenerator *pcVar5;
  cmMakefile *this_00;
  ostream *poVar6;
  string *psVar7;
  size_type sVar8;
  WrapQuotes wrapQuotes;
  undefined1 auVar9 [16];
  basic_string_view<char,_std::char_traits<char>_> __y;
  string_view str;
  bool local_422;
  string_view local_3b8;
  string_view local_3a8;
  char local_392 [2];
  string local_390;
  string local_370;
  int local_34c;
  string local_348;
  undefined1 local_328 [8];
  ostringstream e;
  cmMakefile *mf;
  string *type;
  undefined1 local_150 [16];
  undefined1 local_140 [8];
  string dest;
  undefined1 local_100 [8];
  string unescapedDest;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *config;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  undefined1 local_88 [8];
  cmGeneratorExpression ge;
  undefined1 local_60 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  resultVector;
  cmTargetExport *te_local;
  cmFileSet *fileSet_local;
  cmGeneratorTarget *gte_local;
  cmExportInstallFileGenerator *this_local;
  
  te_local = (cmTargetExport *)fileSet;
  fileSet_local = (cmFileSet *)gte;
  gte_local = (cmGeneratorTarget *)this;
  this_local = (cmExportInstallFileGenerator *)__return_storage_ptr__;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&configs.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cmMakefile::GetGeneratorConfigs_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_60,*(cmMakefile **)&fileSet_local->Name,IncludeEmptyConfig);
  cmakeInstance = cmMakefile::GetCMakeInstance(*(cmMakefile **)&fileSet_local->Name);
  cge._M_t.
  super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  ._M_t.
  super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
  .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl =
       (__uniq_ptr_data<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>,_true,_true>
        )(__uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
          )0x0;
  cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)&cge);
  cmGeneratorExpression::cmGeneratorExpression
            ((cmGeneratorExpression *)local_88,cmakeInstance,(cmListFileBacktrace *)&cge);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&cge);
  ppcVar2 = std::
            map<cmFileSet_*,_cmInstallFileSetGenerator_*,_std::less<cmFileSet_*>,_std::allocator<std::pair<cmFileSet_*const,_cmInstallFileSetGenerator_*>_>_>
            ::at(&te->FileSetGenerators,(key_type *)&te_local);
  cmInstallFileSetGenerator::GetDestination_abi_cxx11_((string *)&__range1,*ppcVar2);
  cmGeneratorExpression::Parse((cmGeneratorExpression *)&stack0xffffffffffffff60,(string *)local_88)
  ;
  std::__cxx11::string::~string((string *)&__range1);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_60);
  config = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_60);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&config);
    if (!bVar1) {
LAB_00a9cc4e:
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_3a8," ");
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_3b8);
      cmJoin(__return_storage_ptr__,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&configs.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,local_3a8,local_3b8);
      local_34c = 1;
LAB_00a9ccb5:
      std::
      unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
      ::~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                     *)&stack0xffffffffffffff60);
      cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_88);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_60);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&configs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      return __return_storage_ptr__;
    }
    unescapedDest.field_2._8_8_ =
         __gnu_cxx::
         __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator*(&__end1);
    pcVar3 = std::
             unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
             ::operator->((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                           *)&stack0xffffffffffffff60);
    headTarget = fileSet_local;
    config_00 = unescapedDest.field_2._8_8_;
    pcVar5 = (cmLocalGenerator *)(fileSet_local->Name)._M_string_length;
    std::__cxx11::string::string((string *)(dest.field_2._M_local_buf + 8));
    wrapQuotes = Wrap;
    psVar4 = cmCompiledGeneratorExpression::Evaluate
                       (pcVar3,pcVar5,(string *)config_00,(cmGeneratorTarget *)headTarget,
                        (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,
                        (string *)(dest.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)local_100,(string *)psVar4);
    std::__cxx11::string::~string((string *)(dest.field_2._M_local_buf + 8));
    auVar9 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_100);
    str._M_len = auVar9._8_8_;
    str._M_str = (char *)0x1;
    local_150 = auVar9;
    cmOutputConverter::EscapeForCMake_abi_cxx11_((string *)local_140,auVar9._0_8_,str,wrapQuotes);
    bVar1 = cmsys::SystemTools::FileIsFullPath((string *)local_100);
    if (!bVar1) {
      cmStrCat<char_const(&)[19],std::__cxx11::string&>
                ((string *)&type,(char (*) [19])"${_IMPORT_PREFIX}/",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140);
      std::__cxx11::string::operator=((string *)local_140,(string *)&type);
      std::__cxx11::string::~string((string *)&type);
    }
    psVar4 = cmFileSet::GetType_abi_cxx11_((cmFileSet *)te_local);
    pcVar3 = std::
             unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
             ::operator->((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                           *)&stack0xffffffffffffff60);
    bVar1 = cmCompiledGeneratorExpression::GetHadContextSensitiveCondition(pcVar3);
    local_422 = false;
    if (bVar1) {
      __x = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar4);
      __y = (basic_string_view<char,_std::char_traits<char>_>)::cm::operator____s("CXX_MODULES",0xb)
      ;
      local_422 = std::operator==(__x,__y);
    }
    if (local_422 == false) {
      pcVar3 = std::
               unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               ::operator->((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                             *)&stack0xffffffffffffff60);
      bVar1 = cmCompiledGeneratorExpression::GetHadContextSensitiveCondition(pcVar3);
      if (bVar1) {
        sVar8 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_60);
        if (sVar8 != 1) {
          cmStrCat<char_const(&)[13],std::__cxx11::string_const&,char_const(&)[3],std::__cxx11::string&,char_const(&)[3]>
                    (&local_370,(char (*) [13])"\"$<$<CONFIG:",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     unescapedDest.field_2._8_8_,(char (*) [3])">:",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140,
                     (char (*) [3])">\"");
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&configs.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_370);
          std::__cxx11::string::~string((string *)&local_370);
          local_34c = 0;
          goto LAB_00a9cbe4;
        }
      }
      local_392[1] = 0x22;
      local_392[0] = '\"';
      cmStrCat<char,std::__cxx11::string&,char>
                (&local_390,local_392 + 1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140,
                 local_392);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &configs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_390);
      std::__cxx11::string::~string((string *)&local_390);
      local_34c = 2;
    }
    else {
      pcVar5 = cmInstallExportGenerator::GetLocalGenerator(this->IEGen);
      this_00 = cmLocalGenerator::GetMakefile(pcVar5);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_328);
      poVar6 = std::operator<<((ostream *)local_328,"The \"");
      psVar7 = cmGeneratorTarget::GetName_abi_cxx11_((cmGeneratorTarget *)fileSet_local);
      poVar6 = std::operator<<(poVar6,(string *)psVar7);
      poVar6 = std::operator<<(poVar6,"\" target\'s interface file set \"");
      psVar7 = cmFileSet::GetName_abi_cxx11_((cmFileSet *)te_local);
      poVar6 = std::operator<<(poVar6,(string *)psVar7);
      poVar6 = std::operator<<(poVar6,"\" of type \"");
      poVar6 = std::operator<<(poVar6,(string *)psVar4);
      std::operator<<(poVar6,
                      "\" contains context-sensitive base file entries which is not supported.");
      std::__cxx11::ostringstream::str();
      cmMakefile::IssueMessage(this_00,FATAL_ERROR,&local_348);
      std::__cxx11::string::~string((string *)&local_348);
      std::__cxx11::string::string((string *)__return_storage_ptr__);
      local_34c = 1;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_328);
    }
LAB_00a9cbe4:
    std::__cxx11::string::~string((string *)local_140);
    std::__cxx11::string::~string((string *)local_100);
    if (local_34c != 0) {
      if (local_34c != 2) goto LAB_00a9ccb5;
      goto LAB_00a9cc4e;
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

std::string cmExportInstallFileGenerator::GetFileSetDirectories(
  cmGeneratorTarget* gte, cmFileSet* fileSet, cmTargetExport* te)
{
  std::vector<std::string> resultVector;

  auto configs =
    gte->Makefile->GetGeneratorConfigs(cmMakefile::IncludeEmptyConfig);

  cmGeneratorExpression ge(*gte->Makefile->GetCMakeInstance());
  auto cge = ge.Parse(te->FileSetGenerators.at(fileSet)->GetDestination());

  for (auto const& config : configs) {
    auto unescapedDest = cge->Evaluate(gte->LocalGenerator, config, gte);
    auto dest = cmOutputConverter::EscapeForCMake(
      unescapedDest, cmOutputConverter::WrapQuotes::NoWrap);
    if (!cmSystemTools::FileIsFullPath(unescapedDest)) {
      dest = cmStrCat("${_IMPORT_PREFIX}/", dest);
    }

    auto const& type = fileSet->GetType();
    // C++ modules do not support interface file sets which are dependent upon
    // the configuration.
    if (cge->GetHadContextSensitiveCondition() && type == "CXX_MODULES"_s) {
      auto* mf = this->IEGen->GetLocalGenerator()->GetMakefile();
      std::ostringstream e;
      e << "The \"" << gte->GetName() << "\" target's interface file set \""
        << fileSet->GetName() << "\" of type \"" << type
        << "\" contains context-sensitive base file entries which is not "
           "supported.";
      mf->IssueMessage(MessageType::FATAL_ERROR, e.str());
      return std::string{};
    }

    if (cge->GetHadContextSensitiveCondition() && configs.size() != 1) {
      resultVector.push_back(
        cmStrCat("\"$<$<CONFIG:", config, ">:", dest, ">\""));
    } else {
      resultVector.emplace_back(cmStrCat('"', dest, '"'));
      break;
    }
  }

  return cmJoin(resultVector, " ");
}